

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void ImportSimpleModuleType(ExpressionContext *ctx,SynBase *source,ModuleContext *moduleCtx,uint i)

{
  IntrusiveList<TypeHandle> arguments_00;
  ByteCode *pBVar1;
  SynBase *this;
  int iVar2;
  SynIdentifier *this_00;
  TypeGenericAlias *pTVar3;
  TypeUnsizedArray *pTVar4;
  TypeArray *pTVar5;
  TypeRef *pTVar6;
  TypeBase *pTVar7;
  TypeHandle *this_01;
  TypeFunction *pTVar8;
  TypeBase **ppTVar9;
  TypeBase *argType;
  undefined1 auStack_98 [4];
  uint n;
  IntrusiveList<TypeHandle> arguments;
  TypeBase *returnType;
  TypeBase *subType_1;
  TypeBase *subType;
  TypeBase *prevType;
  ExternTypeInfo *local_58;
  ExternTypeInfo *type;
  ExternMemberInfo *memberList;
  ExternTypeInfo *typeList;
  char *symbols;
  ByteCode *bCode;
  ModuleData *importModule;
  ModuleContext *pMStack_20;
  uint i_local;
  ModuleContext *moduleCtx_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  bCode = (ByteCode *)moduleCtx->data;
  symbols = (char *)moduleCtx->data->bytecode;
  importModule._4_4_ = i;
  pMStack_20 = moduleCtx;
  moduleCtx_local = (ModuleContext *)source;
  source_local = (SynBase *)ctx;
  typeList = (ExternTypeInfo *)FindSymbols((ByteCode *)symbols);
  memberList = (ExternMemberInfo *)FindFirstType((ByteCode *)symbols);
  type = (ExternTypeInfo *)FindFirstMember((ByteCode *)symbols);
  local_58 = (ExternTypeInfo *)((long)memberList + (ulong)importModule._4_4_ * 0x50);
  switch(local_58->subCat) {
  case CAT_NONE:
    iVar2 = strcmp((char *)((long)&typeList->offsetToName + (ulong)local_58->offsetToName),"generic"
                  );
    this = source_local;
    if (iVar2 == 0) {
      pTVar7 = (TypeBase *)source_local[0x228].begin;
      ppTVar9 = SmallArray<TypeBase_*,_32U>::operator[](&pMStack_20->types,importModule._4_4_);
      pBVar1 = bCode;
      *ppTVar9 = pTVar7;
      ppTVar9 = SmallArray<TypeBase_*,_32U>::operator[](&pMStack_20->types,importModule._4_4_);
      (*ppTVar9)->importModule = (ModuleData *)pBVar1;
    }
    else if (*(char *)((long)&typeList->offsetToName + (ulong)local_58->offsetToName) == '@') {
      this_00 = ExpressionContext::get<SynIdentifier>((ExpressionContext *)source_local);
      InplaceStr::InplaceStr
                ((InplaceStr *)&prevType,
                 (char *)((long)&typeList->offsetToName + (ulong)local_58->offsetToName + 1));
      SynIdentifier::SynIdentifier(this_00,_prevType);
      pTVar3 = ExpressionContext::GetGenericAliasType((ExpressionContext *)this,this_00);
      ppTVar9 = SmallArray<TypeBase_*,_32U>::operator[](&pMStack_20->types,importModule._4_4_);
      pBVar1 = bCode;
      *ppTVar9 = &pTVar3->super_TypeBase;
      ppTVar9 = SmallArray<TypeBase_*,_32U>::operator[](&pMStack_20->types,importModule._4_4_);
      (*ppTVar9)->importModule = (ModuleData *)pBVar1;
    }
    else {
      pTVar7 = CheckPreviousTypeDefinition
                         ((ExpressionContext *)source_local,(SynBase *)moduleCtx_local,pMStack_20,
                          (char *)typeList,local_58,(TypeClass **)0x0);
      if (pTVar7 == (TypeBase *)0x0) {
        anon_unknown.dwarf_e7629::Stop
                  ((ExpressionContext *)source_local,(SynBase *)moduleCtx_local,
                   "ERROR: new type in module %.*s named %s unsupported",
                   (ulong)(uint)((int)(pMStack_20->data->name).end -
                                (int)(pMStack_20->data->name).begin),(pMStack_20->data->name).begin,
                   (long)&typeList->offsetToName + (ulong)local_58->offsetToName);
      }
      else {
        ppTVar9 = SmallArray<TypeBase_*,_32U>::operator[](&pMStack_20->types,importModule._4_4_);
        *ppTVar9 = pTVar7;
      }
    }
    break;
  case CAT_ARRAY:
    pTVar7 = GetImportedModuleTypeAt
                       ((ExpressionContext *)source_local,(SynBase *)moduleCtx_local,pMStack_20,
                        (local_58->field_11).subType);
    if (pTVar7 == (TypeBase *)0x0) {
      anon_unknown.dwarf_e7629::Stop
                ((ExpressionContext *)source_local,(SynBase *)moduleCtx_local,
                 "ERROR: can\'t find sub type for \'%s\' in module %.*s",
                 (long)&typeList->offsetToName + (ulong)local_58->offsetToName,
                 (ulong)(uint)((int)(pMStack_20->data->name).end -
                              (int)(pMStack_20->data->name).begin),(pMStack_20->data->name).begin);
    }
    else {
      if ((local_58->field_8).arrSize == 0xffffffff) {
        pTVar4 = ExpressionContext::GetUnsizedArrayType((ExpressionContext *)source_local,pTVar7);
        ppTVar9 = SmallArray<TypeBase_*,_32U>::operator[](&pMStack_20->types,importModule._4_4_);
        *ppTVar9 = (TypeBase *)pTVar4;
      }
      else {
        pTVar5 = ExpressionContext::GetArrayType
                           ((ExpressionContext *)source_local,pTVar7,
                            (ulong)(local_58->field_8).arrSize);
        ppTVar9 = SmallArray<TypeBase_*,_32U>::operator[](&pMStack_20->types,importModule._4_4_);
        *ppTVar9 = &pTVar5->super_TypeBase;
      }
      pBVar1 = bCode;
      ppTVar9 = SmallArray<TypeBase_*,_32U>::operator[](&pMStack_20->types,importModule._4_4_);
      (*ppTVar9)->importModule = (ModuleData *)pBVar1;
    }
    break;
  case CAT_POINTER:
    pTVar7 = GetImportedModuleTypeAt
                       ((ExpressionContext *)source_local,(SynBase *)moduleCtx_local,pMStack_20,
                        (local_58->field_11).subType);
    if (pTVar7 == (TypeBase *)0x0) {
      anon_unknown.dwarf_e7629::Stop
                ((ExpressionContext *)source_local,(SynBase *)moduleCtx_local,
                 "ERROR: can\'t find sub type for \'%s\' in module %.*s",
                 (long)&typeList->offsetToName + (ulong)local_58->offsetToName,
                 (ulong)(uint)((int)(pMStack_20->data->name).end -
                              (int)(pMStack_20->data->name).begin),(pMStack_20->data->name).begin);
    }
    else {
      pTVar6 = ExpressionContext::GetReferenceType((ExpressionContext *)source_local,pTVar7);
      ppTVar9 = SmallArray<TypeBase_*,_32U>::operator[](&pMStack_20->types,importModule._4_4_);
      pBVar1 = bCode;
      *ppTVar9 = &pTVar6->super_TypeBase;
      ppTVar9 = SmallArray<TypeBase_*,_32U>::operator[](&pMStack_20->types,importModule._4_4_);
      (*ppTVar9)->importModule = (ModuleData *)pBVar1;
    }
    break;
  case CAT_FUNCTION:
    arguments.tail =
         (TypeHandle *)
         GetImportedModuleTypeAt
                   ((ExpressionContext *)source_local,(SynBase *)moduleCtx_local,pMStack_20,
                    (&type->offsetToName)[(ulong)(local_58->field_11).subType * 3]);
    if ((TypeBase *)arguments.tail == (TypeBase *)0x0) {
      anon_unknown.dwarf_e7629::Stop
                ((ExpressionContext *)source_local,(SynBase *)moduleCtx_local,
                 "ERROR: can\'t find return type for \'%s\' in module %.*s",
                 (long)&typeList->offsetToName + (ulong)local_58->offsetToName,
                 (ulong)(uint)((int)(pMStack_20->data->name).end -
                              (int)(pMStack_20->data->name).begin),(pMStack_20->data->name).begin);
    }
    else {
      IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)auStack_98);
      for (argType._4_4_ = 0; argType._4_4_ < (local_58->field_8).arrSize;
          argType._4_4_ = argType._4_4_ + 1) {
        pTVar7 = GetImportedModuleTypeAt
                           ((ExpressionContext *)source_local,(SynBase *)moduleCtx_local,pMStack_20,
                            (&type->offsetToName)
                            [(ulong)((local_58->field_11).subType + argType._4_4_ + 1) * 3]);
        if (pTVar7 == (TypeBase *)0x0) {
          anon_unknown.dwarf_e7629::Stop
                    ((ExpressionContext *)source_local,(SynBase *)moduleCtx_local,
                     "ERROR: can\'t find argument %d type for \'%s\' in module %.*s",
                     (ulong)(argType._4_4_ + 1),
                     (long)&typeList->offsetToName + (ulong)local_58->offsetToName,
                     (ulong)(uint)((int)(pMStack_20->data->name).end -
                                  (int)(pMStack_20->data->name).begin),
                     (pMStack_20->data->name).begin);
        }
        this_01 = ExpressionContext::get<TypeHandle>((ExpressionContext *)source_local);
        TypeHandle::TypeHandle(this_01,pTVar7);
        IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)auStack_98,this_01);
      }
      arguments_00.tail = arguments.head;
      arguments_00.head = _auStack_98;
      pTVar8 = ExpressionContext::GetFunctionType
                         ((ExpressionContext *)source_local,(SynBase *)moduleCtx_local,
                          (TypeBase *)arguments.tail,arguments_00);
      ppTVar9 = SmallArray<TypeBase_*,_32U>::operator[](&pMStack_20->types,importModule._4_4_);
      pBVar1 = bCode;
      *ppTVar9 = &pTVar8->super_TypeBase;
      ppTVar9 = SmallArray<TypeBase_*,_32U>::operator[](&pMStack_20->types,importModule._4_4_);
      (*ppTVar9)->importModule = (ModuleData *)pBVar1;
    }
    break;
  default:
    __assert_fail("!\"unexpected type category\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x3069,
                  "void ImportSimpleModuleType(ExpressionContext &, SynBase *, ModuleContext &, unsigned int)"
                 );
  }
  return;
}

Assistant:

void ImportSimpleModuleType(ExpressionContext &ctx, SynBase *source, ModuleContext &moduleCtx, unsigned i)
{
	ModuleData *importModule = moduleCtx.data;

	ByteCode *bCode = moduleCtx.data->bytecode;
	char *symbols = FindSymbols(bCode);

	ExternTypeInfo *typeList = FindFirstType(bCode);
	ExternMemberInfo *memberList = FindFirstMember(bCode);

	ExternTypeInfo &type = typeList[i];

	switch(type.subCat)
	{
	case ExternTypeInfo::CAT_NONE:
		if(strcmp(symbols + type.offsetToName, "generic") == 0)
		{
			// TODO: explicit category
			moduleCtx.types[i] = ctx.typeGeneric;

			moduleCtx.types[i]->importModule = importModule;
		}
		else if(*(symbols + type.offsetToName) == '@')
		{
			// TODO: explicit category
			moduleCtx.types[i] = ctx.GetGenericAliasType(new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr(symbols + type.offsetToName + 1)));

			moduleCtx.types[i]->importModule = importModule;
		}
		else
		{
			if(TypeBase *prevType = CheckPreviousTypeDefinition(ctx, source, moduleCtx, symbols, type, NULL))
			{
				moduleCtx.types[i] = prevType;
			}
			else
			{
				Stop(ctx, source, "ERROR: new type in module %.*s named %s unsupported", FMT_ISTR(moduleCtx.data->name), symbols + type.offsetToName);
			}
		}
		break;
	case ExternTypeInfo::CAT_ARRAY:
		if(TypeBase *subType = GetImportedModuleTypeAt(ctx, source, moduleCtx, type.subType))
		{

			if(type.arrSize == ~0u)
				moduleCtx.types[i] = ctx.GetUnsizedArrayType(subType);
			else
				moduleCtx.types[i] = ctx.GetArrayType(subType, type.arrSize);

			moduleCtx.types[i]->importModule = importModule;
		}
		else
		{
			Stop(ctx, source, "ERROR: can't find sub type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}
		break;
	case ExternTypeInfo::CAT_POINTER:
		if(TypeBase *subType = GetImportedModuleTypeAt(ctx, source, moduleCtx, type.subType))
		{
			moduleCtx.types[i] = ctx.GetReferenceType(subType);

			moduleCtx.types[i]->importModule = importModule;
		}
		else
		{
			Stop(ctx, source, "ERROR: can't find sub type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}
		break;
	case ExternTypeInfo::CAT_FUNCTION:
		if(TypeBase *returnType = GetImportedModuleTypeAt(ctx, source, moduleCtx, memberList[type.memberOffset].type))
		{
			IntrusiveList<TypeHandle> arguments;

			for(unsigned n = 0; n < type.memberCount; n++)
			{
				TypeBase *argType = GetImportedModuleTypeAt(ctx, source, moduleCtx, memberList[type.memberOffset + n + 1].type);

				if(!argType)
					Stop(ctx, source, "ERROR: can't find argument %d type for '%s' in module %.*s", n + 1, symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));

				arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(argType));
			}

			moduleCtx.types[i] = ctx.GetFunctionType(source, returnType, arguments);

			moduleCtx.types[i]->importModule = importModule;
		}
		else
		{
			Stop(ctx, source, "ERROR: can't find return type for '%s' in module %.*s", symbols + type.offsetToName, FMT_ISTR(moduleCtx.data->name));
		}
		break;
	default:
		assert(!"unexpected type category");
	}
}